

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall slang::parsing::Lexer::scanBlockComment(Lexer *this)

{
  bool bVar1;
  char c_00;
  char cVar2;
  Lexer *in_RDI;
  DiagCode unaff_retaddr;
  char c;
  bool sawUTF8Error;
  Lexer *in_stack_000001f8;
  undefined1 in_stack_ffffffffffffffdf;
  TriviaKind in_stack_ffffffffffffffef;
  undefined2 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff2;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 in_stack_fffffffffffffff7;
  undefined1 uVar3;
  Lexer *this_00;
  
  this_00 = in_RDI;
  bVar1 = tryApplyCommentHandler(in_stack_000001f8);
  if (bVar1) {
    addTrivia((Lexer *)CONCAT17(in_stack_fffffffffffffff7,
                                CONCAT16(in_stack_fffffffffffffff6,
                                         CONCAT42(in_stack_fffffffffffffff2,
                                                  in_stack_fffffffffffffff0))),
              in_stack_ffffffffffffffef);
  }
  else {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            c_00 = peek(in_RDI);
            bVar1 = isASCII(c_00);
            if (bVar1) break;
            scanUTF8Char(in_RDI,(bool)in_stack_ffffffffffffffdf);
          }
          uVar3 = 0;
          if ((c_00 == '*') && (cVar2 = peek(in_RDI,1), cVar2 == '/')) {
            advance(in_RDI,2);
            goto LAB_00681df0;
          }
          if ((c_00 != '/') || (cVar2 = peek(in_RDI,1), cVar2 != '*')) break;
          in_stack_fffffffffffffff2 = 0xb0002;
          currentOffset(in_RDI);
          addDiag(this_00,unaff_retaddr,
                  CONCAT17(uVar3,CONCAT16(c_00,CONCAT42(in_stack_fffffffffffffff2,
                                                        in_stack_fffffffffffffff0))));
          advance(in_RDI,2);
        }
        if (c_00 == '\0') break;
        advance(in_RDI);
      }
      bVar1 = reallyAtEnd(in_RDI);
      if (bVar1) break;
      in_RDI->errorCount = in_RDI->errorCount + 1;
      currentOffset(in_RDI);
      addDiag(this_00,unaff_retaddr,
              CONCAT17(uVar3,CONCAT16(c_00,CONCAT42(in_stack_fffffffffffffff2,
                                                    in_stack_fffffffffffffff0))));
      advance(in_RDI);
    }
    in_stack_ffffffffffffffef = Unknown;
    in_stack_fffffffffffffff0 = 0x12;
    currentOffset(in_RDI);
    addDiag(this_00,unaff_retaddr,
            CONCAT17(uVar3,CONCAT16(c_00,CONCAT42(in_stack_fffffffffffffff2,
                                                  in_stack_fffffffffffffff0))));
LAB_00681df0:
    addTrivia((Lexer *)CONCAT17(uVar3,CONCAT16(c_00,CONCAT42(in_stack_fffffffffffffff2,
                                                             in_stack_fffffffffffffff0))),
              in_stack_ffffffffffffffef);
  }
  return;
}

Assistant:

void Lexer::scanBlockComment() {
    if (tryApplyCommentHandler()) [[unlikely]] {
        addTrivia(TriviaKind::DisabledText);
        return;
    }

    bool sawUTF8Error = false;
    while (true) {
        char c = peek();
        if (isASCII(c)) {
            sawUTF8Error = false;
            if (c == '*' && peek(1) == '/') {
                advance(2);
                break;
            }
            else if (c == '/' && peek(1) == '*') {
                // nested block comments disallowed by the standard; ignore and continue
                addDiag(diag::NestedBlockComment, currentOffset());
                advance(2);
            }
            else if (c == '\0') {
                if (reallyAtEnd()) {
                    addDiag(diag::UnterminatedBlockComment, currentOffset());
                    break;
                }

                // otherwise just error and ignore
                errorCount++;
                addDiag(diag::EmbeddedNull, currentOffset());
                advance();
            }
            else {
                advance();
            }
        }
        else {
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error);
        }
    }

    addTrivia(TriviaKind::BlockComment);
}